

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Part_Man_t * Part_ManStart(int nChunkSize,int nStepSize)

{
  Part_Man_t *pPVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  pPVar1 = (Part_Man_t *)calloc(1,0x28);
  pPVar1->nChunkSize = nChunkSize;
  pPVar1->nStepSize = nStepSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pPVar1->vMemory = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pPVar1->vFree = pVVar2;
  return pPVar1;
}

Assistant:

Part_Man_t * Part_ManStart( int nChunkSize, int nStepSize )
{
    Part_Man_t * p;
    p = ABC_ALLOC( Part_Man_t, 1 );
    memset( p, 0, sizeof(Part_Man_t) );
    p->nChunkSize = nChunkSize;
    p->nStepSize  = nStepSize;
    p->vMemory    = Vec_PtrAlloc( 1000 );
    p->vFree      = Vec_PtrAlloc( 1000 );
    return p;
}